

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.c
# Opt level: O1

void update_controller_states(void)

{
  long lVar1;
  
  lVar1 = SDL_GetKeyboardState(0);
  SDL_PumpEvents();
  controller1_state_0 = *(char *)(lVar1 + 0x1a) != '\0';
  controller1_state_1 = *(char *)(lVar1 + 0x16) != '\0';
  controller1_state_2 = *(char *)(lVar1 + 4) != '\0';
  controller1_state_3 = *(char *)(lVar1 + 7) != '\0';
  controller1_state_4 = *(char *)(lVar1 + 0x52) != '\0';
  controller1_state_5 = *(char *)(lVar1 + 0x50) != '\0';
  controller1_state_6 = *(char *)(lVar1 + 0x28) != '\0';
  controller1_state_7 = *(char *)(lVar1 + 0xf) != '\0';
  quit = *(char *)(lVar1 + 0x29) != '\0';
  return;
}

Assistant:

void update_controller_states() {
    const Uint8 *keys = SDL_GetKeyboardState(NULL);
    SDL_PumpEvents();

    controller1_state.up_pressed = keys[SDL_SCANCODE_W];
    controller1_state.down_pressed = keys[SDL_SCANCODE_S];
    controller1_state.left_pressed = keys[SDL_SCANCODE_A];
    controller1_state.right_pressed = keys[SDL_SCANCODE_D];
    controller1_state.A_pressed = keys[SDL_SCANCODE_UP];
    controller1_state.B_pressed = keys[SDL_SCANCODE_LEFT];
    controller1_state.start_pressed = keys[SDL_SCANCODE_RETURN];
    controller1_state.select_pressed = keys[SDL_SCANCODE_L];
    quit = keys[SDL_SCANCODE_ESCAPE];
}